

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3,
          Operand_ *o4,Operand_ *o5)

{
  ZoneHeap *this_00;
  char *__s;
  Zone *pZVar1;
  uint32_t uVar2;
  anon_union_8_2_78723da6_for_MemData_2 aVar3;
  RegOnly RVar4;
  uint32_t uVar5;
  ushort uVar6;
  Error EVar7;
  int iVar8;
  CBJump *node;
  CBJump *pCVar9;
  CBLabel **ppCVar10;
  undefined4 extraout_var;
  char *str;
  uint uVar11;
  CBJump *pCVar12;
  uint count;
  RegOnly *pRVar13;
  Error unaff_R13D;
  uint uVar14;
  Error unaff_R15D;
  Detail instDetail;
  StringBuilderTmp<256UL> sb;
  Operand opArray [6];
  RegOnly *local_200;
  ushort local_1e8;
  Operand_ *local_1d8;
  Detail local_1d0;
  StringBuilder local_1c0;
  CBLabel local_1a0 [4];
  anon_union_16_7_ed616b9d_for_Operand__0 local_98;
  UInt64 local_88;
  anon_union_8_2_78723da6_for_MemData_2 aStack_80;
  UInt64 local_78;
  anon_union_8_2_78723da6_for_MemData_2 aStack_70;
  UInt64 local_68;
  anon_union_8_2_78723da6_for_MemData_2 aStack_60;
  UInt64 local_58;
  anon_union_8_2_78723da6_for_MemData_2 aStack_50;
  UInt64 local_48;
  anon_union_8_2_78723da6_for_MemData_2 aStack_40;
  
  pRVar13 = (RegOnly *)(ulong)instId;
  uVar14 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._globalOptions |
           (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options;
  __s = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment;
  uVar11 = 5;
  if ((undefined1  [16])((undefined1  [16])o4->field_0 & (undefined1  [16])0x7) ==
      (undefined1  [16])0x0) {
    uVar11 = ((((uint)((undefined1  [16])((undefined1  [16])o1->field_0 & (undefined1  [16])0x7) !=
                      (undefined1  [16])0x0) -
               (uint)((undefined1  [16])((undefined1  [16])o0->field_0 & (undefined1  [16])0x7) ==
                     (undefined1  [16])0x0)) -
              (uint)((undefined1  [16])((undefined1  [16])o2->field_0 & (undefined1  [16])0x7) ==
                    (undefined1  [16])0x0)) + 3) -
             (uint)((undefined1  [16])((undefined1  [16])o3->field_0 & (undefined1  [16])0x7) ==
                   (undefined1  [16])0x0);
  }
  count = 6;
  if ((undefined1  [16])((undefined1  [16])o5->field_0 & (undefined1  [16])0x7) ==
      (undefined1  [16])0x0) {
    count = uVar11;
  }
  if ((uVar14 & 3) != 0) {
    EVar7 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._lastError;
    if (EVar7 != 0) {
      return EVar7;
    }
    if ((uVar14 & 2) != 0) {
      local_98._packed[0].field_10 = (o0->field_0)._packed[0];
      local_98._mem.field_2 = (o0->field_0)._mem.field_2;
      local_88 = (o1->field_0)._packed[0];
      aStack_80 = (o1->field_0)._mem.field_2;
      local_78 = (o2->field_0)._packed[0];
      aStack_70 = (o2->field_0)._mem.field_2;
      local_68 = (o3->field_0)._packed[0];
      aStack_60 = (o3->field_0)._mem.field_2;
      local_58 = (o4->field_0)._packed[0];
      aStack_50 = (o4->field_0)._mem.field_2;
      local_48 = (o5->field_0)._packed[0];
      aStack_40 = (o5->field_0)._mem.field_2;
      local_1d0.extraReg = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
      local_1d0.instId = instId;
      local_1d0.options = uVar14;
      unaff_R13D = Inst::validate((uint)(this->super_CodeCompiler).super_CodeBuilder.
                                        super_CodeEmitter._codeInfo._archInfo.field_0.field_0._type,
                                  &local_1d0,(Operand_ *)&local_98._any,count);
      local_200 = (RegOnly *)o3;
      local_1d8 = o0;
      if (unaff_R13D == 0) goto LAB_0017086a;
      local_1c0._data = (char *)local_1a0;
      local_1a0[0].super_CBNode._prev._0_1_ = 0;
      local_1c0._length = 0;
      local_1c0._capacity = 0x100;
      local_1c0._canFree = 0;
      str = DebugUtils::errorAsString(unaff_R13D);
      StringBuilder::_opString(&local_1c0,1,str,0xffffffffffffffff);
      StringBuilder::_opString(&local_1c0,1,": ",0xffffffffffffffff);
      Logging::formatInstruction
                (&local_1c0,0,(CodeEmitter *)this,
                 (uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._codeInfo.
                       _archInfo.field_0.field_0._type,&local_1d0,(Operand_ *)&local_98._any,count);
      unaff_R15D = CodeEmitter::setLastError((CodeEmitter *)this,unaff_R13D,local_1c0._data);
      StringBuilder::~StringBuilder(&local_1c0);
      goto LAB_0017086e;
    }
  }
  do {
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options = 0;
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment = (char *)0x0;
    uVar2 = (uint32_t)pRVar13;
    this_00 = &(this->super_CodeCompiler).super_CodeBuilder._cbHeap;
    pZVar1 = (this->super_CodeCompiler).super_CodeBuilder._cbHeap._zone;
    if (uVar2 - 0x113 < 0x20 || uVar2 - 0x176 < 3) {
      if (pZVar1 != (Zone *)0x0) {
        node = (CBJump *)ZoneHeap::_alloc(this_00,(ulong)(count * 0x10 + 0x58),(size_t *)&local_1c0)
        ;
        if (node == (CBJump *)0x0) {
LAB_0017084c:
          EVar7 = CodeEmitter::setLastError((CodeEmitter *)this,1,(char *)0x0);
          return EVar7;
        }
        pCVar9 = node + 1;
        if (count != 0) {
          aVar3 = (o0->field_0)._mem.field_2;
          (pCVar9->super_CBInst).super_CBNode._prev = (CBNode *)(o0->field_0)._packed[0];
          node[1].super_CBInst.super_CBNode._next = (CBNode *)aVar3;
        }
        if (1 < count) {
          aVar3 = (o1->field_0)._mem.field_2;
          *(UInt64 *)&node[1].super_CBInst.super_CBNode._type = (o1->field_0)._packed[0];
          node[1].super_CBInst.super_CBNode._inlineComment = (char *)aVar3;
        }
        if (2 < count) {
          aVar3 = (o2->field_0)._mem.field_2;
          node[1].super_CBInst.super_CBNode._passData = (void *)(o2->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[1].super_CBInst._instDetail = aVar3;
        }
        if (3 < count) {
          RVar4 = *(RegOnly *)((long)o3 + 8);
          node[1].super_CBInst._instDetail.extraReg = *(RegOnly *)o3;
          *(RegOnly *)&node[1].super_CBInst._memOpIndex = RVar4;
        }
        if (4 < count) {
          aVar3 = (o4->field_0)._mem.field_2;
          node[1].super_CBInst._opArray = (Operand *)(o4->field_0)._packed[0];
          node[1]._target = (CBLabel *)aVar3;
        }
        if (5 < count) {
          aVar3 = (o5->field_0)._mem.field_2;
          node[1]._jumpNext = (CBJump *)(o5->field_0)._packed[0];
          node[2].super_CBInst.super_CBNode._prev = (CBNode *)aVar3;
        }
        (node->super_CBInst).super_CBNode._prev = (CBNode *)0x0;
        (node->super_CBInst).super_CBNode._next = (CBNode *)0x0;
        (node->super_CBInst).super_CBNode._type = '\x01';
        (node->super_CBInst).super_CBNode._opCount = '\0';
        uVar6 = (ushort)(this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
        (node->super_CBInst).super_CBNode._flags = uVar6;
        (node->super_CBInst).super_CBNode._position =
             (this->super_CodeCompiler).super_CodeBuilder._position;
        (node->super_CBInst).super_CBNode._inlineComment = (char *)0x0;
        (node->super_CBInst).super_CBNode._passData = (void *)0x0;
        (node->super_CBInst)._instDetail.instId = 0;
        (node->super_CBInst)._instDetail.options = 0;
        (node->super_CBInst)._instDetail.extraReg._signature = 0;
        (node->super_CBInst)._instDetail.extraReg._id = 0;
        (node->super_CBInst).super_CBNode._flags = uVar6 | 4;
        (node->super_CBInst)._instDetail.instId = uVar2;
        (node->super_CBInst)._instDetail.options = uVar14;
        (node->super_CBInst).super_CBNode._opCount = (uint8_t)count;
        (node->super_CBInst)._opArray = (Operand *)pCVar9;
        if (count == 0) {
          uVar11 = 0xff;
          goto LAB_001705d5;
        }
        uVar11 = 0;
        pCVar12 = pCVar9;
        goto LAB_0017048e;
      }
      _emit();
    }
    else if (pZVar1 != (Zone *)0x0) {
      node = (CBJump *)ZoneHeap::_alloc(this_00,(ulong)(count * 0x10 + 0x48),(size_t *)&local_1c0);
      if (node == (CBJump *)0x0) goto LAB_0017084c;
      ppCVar10 = &node->_target;
      if (count != 0) {
        aVar3 = (o0->field_0)._mem.field_2;
        *ppCVar10 = (CBLabel *)(o0->field_0)._packed[0];
        node->_jumpNext = (CBJump *)aVar3;
      }
      if (1 < count) {
        aVar3 = (o1->field_0)._mem.field_2;
        node[1].super_CBInst.super_CBNode._prev = (CBNode *)(o1->field_0)._packed[0];
        node[1].super_CBInst.super_CBNode._next = (CBNode *)aVar3;
      }
      if (2 < count) {
        aVar3 = (o2->field_0)._mem.field_2;
        *(UInt64 *)&node[1].super_CBInst.super_CBNode._type = (o2->field_0)._packed[0];
        node[1].super_CBInst.super_CBNode._inlineComment = (char *)aVar3;
      }
      if (3 < count) {
        uVar2 = ((RegOnly *)((long)o3 + 8))->_signature;
        uVar5 = ((RegOnly *)((long)o3 + 8))->_id;
        node[1].super_CBInst.super_CBNode._passData = (void *)*(RegOnly *)o3;
        node[1].super_CBInst._instDetail.instId = uVar2;
        node[1].super_CBInst._instDetail.options = uVar5;
      }
      if (4 < count) {
        aVar3 = (o4->field_0)._mem.field_2;
        node[1].super_CBInst._instDetail.extraReg = (RegOnly)(o4->field_0)._packed[0];
        *(anon_union_8_2_78723da6_for_MemData_2 *)&node[1].super_CBInst._memOpIndex = aVar3;
      }
      if (5 < count) {
        aVar3 = (o5->field_0)._mem.field_2;
        node[1].super_CBInst._opArray = (Operand *)(o5->field_0)._packed[0];
        node[1]._target = (CBLabel *)aVar3;
      }
      (node->super_CBInst).super_CBNode._prev = (CBNode *)0x0;
      (node->super_CBInst).super_CBNode._next = (CBNode *)0x0;
      (node->super_CBInst).super_CBNode._type = '\x01';
      (node->super_CBInst).super_CBNode._opCount = '\0';
      uVar6 = (ushort)(this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
      (node->super_CBInst).super_CBNode._flags = uVar6;
      (node->super_CBInst).super_CBNode._position =
           (this->super_CodeCompiler).super_CodeBuilder._position;
      *(undefined1 (*) [32])&(node->super_CBInst).super_CBNode._inlineComment = ZEXT432(0) << 0x40;
      (node->super_CBInst).super_CBNode._flags = uVar6 | 4;
      local_1e8 = (ushort)pRVar13;
      (node->super_CBInst)._instDetail.instId = (uint)local_1e8;
      (node->super_CBInst)._instDetail.options = uVar14;
      (node->super_CBInst).super_CBNode._opCount = (uint8_t)count;
      (node->super_CBInst)._opArray = (Operand *)ppCVar10;
      if (count == 0) {
        uVar11 = 0xff;
        goto LAB_0017063e;
      }
      uVar11 = 0;
      break;
    }
    _emit();
    pRVar13 = (RegOnly *)o3;
LAB_0017086a:
    uVar14 = uVar14 & 0xfffffffd;
LAB_0017086e:
    o0 = local_1d8;
    o3 = (Operand_ *)local_200;
    if (unaff_R13D != 0) {
      return unaff_R15D;
    }
  } while( true );
  while( true ) {
    uVar11 = uVar11 + 1;
    ppCVar10 = ppCVar10 + 2;
    if (count == uVar11) break;
    if (((ulong)*ppCVar10 & 7) == 2) goto LAB_0017063e;
  }
  uVar11 = 0xff;
LAB_0017063e:
  (node->super_CBInst)._memOpIndex = (uint8_t)uVar11;
  (node->super_CBInst)._instDetail.extraReg =
       (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  goto joined_r0x00170655;
  while( true ) {
    uVar11 = uVar11 + 1;
    pCVar12 = (CBJump *)&(pCVar12->super_CBInst).super_CBNode._type;
    if (count == uVar11) break;
LAB_0017048e:
    if (((ulong)(pCVar12->super_CBInst).super_CBNode._prev & 7) == 2) goto LAB_001705d5;
  }
  uVar11 = 0xff;
LAB_001705d5:
  (node->super_CBInst)._memOpIndex = (uint8_t)uVar11;
  node->_target = (CBLabel *)0x0;
  node->_jumpNext = (CBJump *)0x0;
  (node->super_CBInst)._instDetail.extraReg =
       (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  local_1c0._data = (char *)0x0;
  if ((uVar14 & 0x10) == 0) {
    if (((ulong)(pCVar9->super_CBInst).super_CBNode._prev & 7) == 4) {
      EVar7 = CodeBuilder::getCBLabel
                        ((CodeBuilder *)this,(CBLabel **)&local_1c0,
                         *(uint32_t *)((long)&node[1].super_CBInst.super_CBNode._prev + 4));
      if (EVar7 != 0) {
        EVar7 = CodeEmitter::setLastError((CodeEmitter *)this,EVar7,(char *)0x0);
        return EVar7;
      }
    }
    else {
      uVar14 = uVar14 | 0x10;
    }
  }
  (node->super_CBInst)._instDetail.options = uVar14;
  uVar6 = 0x50;
  if (uVar2 != 0x11e) {
    uVar6 = 0x20;
  }
  uVar6 = uVar6 | (node->super_CBInst).super_CBNode._flags;
  (node->super_CBInst).super_CBNode._flags = uVar6;
  node->_target = (CBLabel *)local_1c0._data;
  node->_jumpNext = (CBJump *)0x0;
  if ((CBLabel *)local_1c0._data != (CBLabel *)0x0) {
    node->_jumpNext = *(CBJump **)((long)local_1c0._data + 0x30);
    *(CBJump **)((long)local_1c0._data + 0x30) = node;
    *(uint32_t *)((long)local_1c0._data + 0x2c) = *(uint32_t *)((long)local_1c0._data + 0x2c) + 1;
  }
  if ((uVar2 == 0x11e) || ((uVar14 & 0x100) != 0)) {
    (node->super_CBInst).super_CBNode._flags = uVar6 | 0x40;
  }
joined_r0x00170655:
  if (__s != (char *)0x0) {
    strlen(__s);
    iVar8 = Zone::dup(&(this->super_CodeCompiler).super_CodeBuilder._cbDataZone,(int)__s);
    (node->super_CBInst).super_CBNode._inlineComment = (char *)CONCAT44(extraout_var,iVar8);
  }
  CodeBuilder::addNode((CodeBuilder *)this,(CBNode *)node);
  return 0;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3, const Operand_& o4, const Operand_& o5) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Count 5th and 6th operands.
  if (!o4.isNone()) opCount = 5;
  if (!o5.isNone()) opCount = 6;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3),
        Operand(o4),
        Operand(o5)
      };

      Inst::Detail instDetail(instId, options, _extraReg);
      Error err = Inst::validate(getArchType(), instDetail, opArray, opCount);

      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instDetail, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}